

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,string_view input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 extraout_EDX;
  ParseContext *ctx_00;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  char *ptr;
  ParseContext ctx;
  ushort *local_b8;
  ushort *local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  ParseContext local_98;
  
  ctx_00 = (ParseContext *)input._M_str;
  local_a8._M_str = (char *)input._M_len;
  local_a8._M_len = (size_t)this;
  ParseContext::ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
            (&local_98,io::CodedInputStream::default_recursion_limit_,false,(char **)&local_b0,
             &local_a8);
  local_b8 = local_b0;
  while( true ) {
    bVar1 = ParseContext::Done(&local_98,(char **)&local_b8);
    auVar4._8_4_ = extraout_EDX;
    auVar4._0_8_ = local_b8;
    if (bVar1) break;
    uVar2 = (uint)(byte)(msg->_internal_metadata_).ptr_ & (uint)*local_b8;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    auVar4 = (**(code **)((long)&msg[3]._internal_metadata_.ptr_ + uVar3 * 2))
                       (ctx_00,local_b8,&local_98,
                        (ulong)*local_b8 ^ *(ulong *)((long)&msg[4]._vptr_MessageLite + uVar3 * 2),
                        msg,0);
    local_b8 = auVar4._0_8_;
    if ((local_b8 == (ushort *)0x0) || (local_98.super_EpsCopyInputStream.last_tag_minus_1_ != 0))
    break;
  }
  local_b8 = auVar4._0_8_;
  local_b0 = local_b8;
  if (((msg->_internal_metadata_).ptr_ & 0x100) != 0) {
    auVar5 = (*(code *)msg[2]._internal_metadata_.ptr_)(ctx_00,local_b8,&local_98);
    auVar4._8_4_ = auVar5._8_4_;
    auVar4._0_8_ = local_b8;
    local_b0 = auVar5._0_8_;
  }
  local_b8 = auVar4._0_8_;
  bVar1 = false;
  if ((local_b0 != (ushort *)0x0) &&
     (bVar1 = false, local_98.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) {
    bVar1 = anon_unknown_18::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)tc_table & 0xffffffff),auVar4._8_4_);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(absl::string_view input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}